

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

cmGlobalGenerator * __thiscall cmake::CreateGlobalGenerator(cmake *this,string *gname)

{
  int iVar1;
  iterator iVar2;
  cmExternalMakefileProjectGenerator *this_00;
  undefined4 extraout_var;
  pointer ppcVar3;
  string name;
  key_type kStack_68;
  string local_48;
  cmGlobalGenerator *this_01;
  
  std::__cxx11::string::string((string *)&kStack_68,(string *)gname);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
          ::find(&(this->ExtraGenerators)._M_t,&kStack_68);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = (cmExternalMakefileProjectGenerator *)0x0;
  }
  else {
    this_00 = (cmExternalMakefileProjectGenerator *)(**(code **)(iVar2._M_node + 2))();
    cmExternalMakefileProjectGenerator::GetGlobalGeneratorName(&local_48,this_00,&kStack_68);
    std::__cxx11::string::operator=((string *)&kStack_68,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  ppcVar3 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppcVar3 ==
        (this->Generators).
        super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (this_00 != (cmExternalMakefileProjectGenerator *)0x0) {
        (*this_00->_vptr_cmExternalMakefileProjectGenerator[1])(this_00);
      }
      this_01 = (cmGlobalGenerator *)0x0;
      goto LAB_00286a57;
    }
    iVar1 = (*(*ppcVar3)->_vptr_cmGlobalGeneratorFactory[2])(*ppcVar3,&kStack_68,this);
    this_01 = (cmGlobalGenerator *)CONCAT44(extraout_var,iVar1);
    ppcVar3 = ppcVar3 + 1;
  } while (this_01 == (cmGlobalGenerator *)0x0);
  cmGlobalGenerator::SetExternalMakefileProjectGenerator(this_01,this_00);
LAB_00286a57:
  std::__cxx11::string::~string((string *)&kStack_68);
  return this_01;
}

Assistant:

cmGlobalGenerator* cmake::CreateGlobalGenerator(const std::string& gname)
{
  cmExternalMakefileProjectGenerator* extraGenerator = 0;
  std::string name = gname;
  RegisteredExtraGeneratorsMap::const_iterator extraGenIt =
                                            this->ExtraGenerators.find(name);
  if (extraGenIt != this->ExtraGenerators.end())
    {
    extraGenerator = (extraGenIt->second)();
    name = extraGenerator->GetGlobalGeneratorName(name);
    }

  cmGlobalGenerator* generator = 0;
  for (RegisteredGeneratorsVector::const_iterator i =
    this->Generators.begin(); i != this->Generators.end(); ++i)
    {
    generator = (*i)->CreateGlobalGenerator(name, this);
    if (generator)
      {
      break;
      }
    }

  if (generator)
    {
    generator->SetExternalMakefileProjectGenerator(extraGenerator);
    }
  else
    {
    delete extraGenerator;
    }

  return generator;
}